

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ParserResult * __thiscall
Catch::clara::detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]magic_enum/test/3rdparty/Catch2/include/catch2/catch.hpp:9734:35)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]magic_enum_test_3rdparty_Catch2_include_catch2_catch_hpp:9734:35)>
          *this,string *arg)

{
  bool bVar1;
  InWhatOrder IVar2;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  BasicResult<Catch::clara::detail::ParseResultType> local_50;
  
  temp._M_dataplus._M_p = (pointer)&temp.field_2;
  temp._M_string_length = 0;
  temp.field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::_M_assign((string *)&temp);
  local_50.m_errorMessage._M_dataplus._M_p = (pointer)&local_50.m_errorMessage.field_2;
  local_50.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.m_type = Ok
  ;
  local_50.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase._12_4_ = 0;
  local_50.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__BasicResult_0017a8c8;
  local_50.m_errorMessage._M_string_length = 0;
  local_50.m_errorMessage.field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"declared",(allocator<char> *)&local_70);
  bVar1 = startsWith(&local_b0,&temp);
  ::std::__cxx11::string::~string((string *)&local_b0);
  IVar2 = InDeclarationOrder;
  if (!bVar1) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"lexical",(allocator<char> *)&local_70);
    bVar1 = startsWith(&local_b0,&temp);
    ::std::__cxx11::string::~string((string *)&local_b0);
    if (bVar1) {
      IVar2 = InLexicographicalOrder;
    }
    else {
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"random",(allocator<char> *)&local_70);
      bVar1 = startsWith(&local_b0,&temp);
      ::std::__cxx11::string::~string((string *)&local_b0);
      if (!bVar1) {
        ::std::operator+(&local_70,"Unrecognised ordering: \'",&temp);
        ::std::operator+(&local_b0,&local_70,"\'");
        BasicResult<Catch::clara::detail::ParseResultType>::runtimeError
                  (__return_storage_ptr__,&local_b0);
        ::std::__cxx11::string::~string((string *)&local_b0);
        ::std::__cxx11::string::~string((string *)&local_70);
        goto LAB_00129006;
      }
      IVar2 = InRandomOrder;
    }
  }
  ((this->m_lambda).config)->runOrder = IVar2;
  *(undefined8 *)
   &(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase.m_type = 0;
  (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
  super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_0017a8c8;
  (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
  (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
  (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
LAB_00129006:
  BasicResult<Catch::clara::detail::ParseResultType>::~BasicResult(&local_50);
  ::std::__cxx11::string::~string((string *)&temp);
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const &arg ) -> ParserResult override {
            return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>( m_lambda, arg );
        }